

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

int __thiscall
LASwriteItemCompressed_BYTE14_v4::init(LASwriteItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  BOOL BVar2;
  ulong uVar3;
  ByteStreamOutArray **ppBVar4;
  ByteStreamOutArrayLE *this_00;
  ByteStreamOutArrayBE *this_01;
  ArithmeticEncoder **ppAVar5;
  ArithmeticEncoder *this_02;
  undefined7 extraout_var;
  U32 *in_RDX;
  uint local_38;
  U32 c;
  uint local_24;
  U32 i;
  U32 *context_local;
  U8 *item_local;
  LASwriteItemCompressed_BYTE14_v4 *this_local;
  
  if (this->outstream_Bytes == (ByteStreamOutArray **)0x0) {
    auVar1 = ZEXT416(this->number) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppBVar4 = (ByteStreamOutArray **)operator_new__(uVar3);
    this->outstream_Bytes = ppBVar4;
    BVar2 = IS_LITTLE_ENDIAN();
    if (BVar2) {
      for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
        this_00 = (ByteStreamOutArrayLE *)operator_new(0x40);
        ByteStreamOutArrayLE::ByteStreamOutArrayLE(this_00,0x1000);
        this->outstream_Bytes[local_24] = (ByteStreamOutArray *)this_00;
      }
    }
    else {
      for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
        this_01 = (ByteStreamOutArrayBE *)operator_new(0x40);
        ByteStreamOutArrayBE::ByteStreamOutArrayBE(this_01,0x1000);
        this->outstream_Bytes[local_24] = (ByteStreamOutArray *)this_01;
      }
    }
    auVar1 = ZEXT416(this->number) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppAVar5 = (ArithmeticEncoder **)operator_new__(uVar3);
    this->enc_Bytes = ppAVar5;
    for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
      this_02 = (ArithmeticEncoder *)operator_new(0x30);
      ArithmeticEncoder::ArithmeticEncoder(this_02);
      this->enc_Bytes[local_24] = this_02;
    }
  }
  else {
    for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
      (*(this->outstream_Bytes[local_24]->super_ByteStreamOut)._vptr_ByteStreamOut[10])
                (this->outstream_Bytes[local_24],0);
    }
  }
  for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
    ArithmeticEncoder::init
              (this->enc_Bytes[local_24],(EVP_PKEY_CTX *)this->outstream_Bytes[local_24]);
  }
  for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
    this->changed_Bytes[local_24] = false;
  }
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    this->contexts[local_38].unused = true;
  }
  this->current_context = *in_RDX;
  createAndInitModelsAndCompressors(this,this->current_context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* on the first init create outstreams and encoders */

  if (outstream_Bytes == 0)
  {
    /* create outstreams pointer array */

    outstream_Bytes = new ByteStreamOutArray*[number];

    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayBE();
      }
    }

    /* create encoder pointer array */

    enc_Bytes = new ArithmeticEncoder*[number];

    /* create layer encoders */

    for (i = 0; i < number; i++)
    {
      enc_Bytes[i] = new ArithmeticEncoder();
    }
  }
  else
  {
    /* otherwise just seek back */

    for (i = 0; i < number; i++)
    {
      outstream_Bytes[i]->seek(0);
    }
  }
  
  /* init layer encoders */

  for (i = 0; i < number; i++)
  {
    enc_Bytes[i]->init(outstream_Bytes[i]);
  }

  /* set changed booleans to FALSE */

  for (i = 0; i < number; i++)
  {
    changed_Bytes[i] = FALSE;
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init context from item)  */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}